

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

string * __thiscall CLI::Option::matching_name_abi_cxx11_(Option *this,Option *other)

{
  string *psVar1;
  bool bVar2;
  int iVar3;
  string *lname_1;
  string *psVar4;
  string *sname;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if ((matching_name[abi:cxx11](CLI::Option_const&)::estring_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&matching_name[abi:cxx11](CLI::Option_const&)::estring_abi_cxx11_)
     , iVar3 != 0)) {
    matching_name[abi:cxx11](CLI::Option_const&)::estring_abi_cxx11_._M_dataplus._M_p =
         (pointer)&matching_name[abi:cxx11](CLI::Option_const&)::estring_abi_cxx11_.field_2;
    matching_name[abi:cxx11](CLI::Option_const&)::estring_abi_cxx11_._M_string_length = 0;
    matching_name[abi:cxx11](CLI::Option_const&)::estring_abi_cxx11_.field_2._M_local_buf[0] = '\0';
    __cxa_atexit(::std::__cxx11::string::~string,
                 &matching_name[abi:cxx11](CLI::Option_const&)::estring_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&matching_name[abi:cxx11](CLI::Option_const&)::estring_abi_cxx11_);
  }
  psVar1 = (this->snames_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar4 = (this->snames_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar1; psVar4 = psVar4 + 1) {
    ::std::__cxx11::string::string((string *)&local_50,(string *)psVar4);
    bVar2 = check_sname(other,&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
    if (bVar2) {
      return psVar4;
    }
  }
  psVar1 = (this->lnames_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar4 = (this->lnames_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar1; psVar4 = psVar4 + 1) {
    ::std::__cxx11::string::string((string *)&local_70,(string *)psVar4);
    bVar2 = check_lname(other,&local_70);
    ::std::__cxx11::string::~string((string *)&local_70);
    if (bVar2) {
      return psVar4;
    }
  }
  if (((this->super_OptionBase<CLI::Option>).ignore_case_ != false) ||
     ((this->super_OptionBase<CLI::Option>).ignore_underscore_ == true)) {
    psVar1 = (other->snames_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar4 = (other->snames_).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar1; psVar4 = psVar4 + 1)
    {
      ::std::__cxx11::string::string((string *)&local_90,(string *)psVar4);
      bVar2 = check_sname(this,&local_90);
      ::std::__cxx11::string::~string((string *)&local_90);
      if (bVar2) {
        return psVar4;
      }
    }
    psVar1 = (other->lnames_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar4 = (other->lnames_).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar1; psVar4 = psVar4 + 1)
    {
      ::std::__cxx11::string::string((string *)&local_b0,(string *)psVar4);
      bVar2 = check_lname(this,&local_b0);
      ::std::__cxx11::string::~string((string *)&local_b0);
      if (bVar2) {
        return psVar4;
      }
    }
  }
  return &matching_name[abi:cxx11](CLI::Option_const&)::estring_abi_cxx11_;
}

Assistant:

const std::string &matching_name(const Option &other) const {
        static const std::string estring;
        for(const std::string &sname : snames_)
            if(other.check_sname(sname))
                return sname;
        for(const std::string &lname : lnames_)
            if(other.check_lname(lname))
                return lname;

        if(ignore_case_ ||
           ignore_underscore_) { // We need to do the inverse, in case we are ignore_case or ignore underscore
            for(const std::string &sname : other.snames_)
                if(check_sname(sname))
                    return sname;
            for(const std::string &lname : other.lnames_)
                if(check_lname(lname))
                    return lname;
        }
        return estring;
    }